

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_fcmlah_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  ushort uVar1;
  float16 fVar2;
  float16 fVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar8;
  uintptr_t i;
  ushort local_68;
  ushort local_64;
  ulong uVar6;
  
  uVar4 = desc * 8 & 0xff;
  uVar5 = uVar4 + 8;
  uVar6 = (ulong)uVar5;
  uVar7 = (ulong)(desc >> 9 & 2);
  uVar8 = 0;
  do {
    fVar3 = *(float16 *)((long)vn + uVar8 * 2 + uVar7);
    local_64 = (ushort)((desc >> 10 ^ desc >> 0xb) << 0xf);
    uVar1 = *(ushort *)((long)vm + uVar8 * 2 + (2 - uVar7));
    local_68 = (ushort)((desc >> 0xb) << 0xf);
    fVar2 = float16_muladd_arm(fVar3,*(ushort *)((long)vm + uVar8 * 2 + uVar7) ^ local_64,
                               *(float16 *)((long)vd + uVar8 * 2),0,(float_status *)vfpst);
    *(float16 *)((long)vd + uVar8 * 2) = fVar2;
    fVar3 = float16_muladd_arm(fVar3,uVar1 ^ local_68,*(float16 *)((long)vd + uVar8 * 2 + 2),0,
                               (float_status *)vfpst);
    *(float16 *)((long)vd + uVar8 * 2 + 2) = fVar3;
    uVar8 = uVar8 + 2;
  } while (uVar8 < uVar5 >> 1);
  uVar5 = desc >> 2 & 0xf8;
  if (uVar4 < uVar5) {
    uVar8 = (ulong)(uVar5 + 8);
    uVar7 = uVar6 + 8;
    if (uVar6 + 8 < uVar8) {
      uVar7 = uVar8;
    }
    memset((void *)((long)vd + uVar6),0,(~uVar6 + uVar7 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_fcmlah)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float16 *d = vd;
    float16 *n = vn;
    float16 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    uint32_t neg_real = flip ^ neg_imag;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 15;
    neg_imag <<= 15;

    for (i = 0; i < opr_sz / 2; i += 2) {
        float16 e2 = n[H2(i + flip)];
        float16 e1 = m[H2(i + flip)] ^ neg_real;
        float16 e4 = e2;
        float16 e3 = m[H2(i + 1 - flip)] ^ neg_imag;

        d[H2(i)] = float16_muladd(e2, e1, d[H2(i)], 0, fpst);
        d[H2(i + 1)] = float16_muladd(e4, e3, d[H2(i + 1)], 0, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}